

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

int testing::internal::ExecDeathTestChildMain(void *child_arg)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  undefined8 *puVar4;
  long *plVar5;
  undefined8 *puVar6;
  size_type *psVar7;
  ulong *puVar8;
  undefined8 uVar9;
  ulong uVar10;
  ulong **ppuVar11;
  ulong *local_120;
  long local_118;
  ulong local_110;
  long lStack_108;
  string local_100;
  ulong *local_e0;
  long local_d8;
  ulong local_d0;
  long lStack_c8;
  undefined8 *local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  long *local_a0;
  long local_98;
  long local_90;
  long lStack_88;
  int local_7c;
  ulong *local_78;
  long local_70;
  ulong local_68 [2];
  long *local_58;
  long local_50;
  long local_48;
  long lStack_40;
  string local_38;
  
  do {
    iVar1 = close(*(int *)((long)child_arg + 8));
    if (iVar1 != -1) {
      UnitTest::GetInstance();
      iVar1 = chdir(((UnitTest::GetInstance::instance.impl_)->original_working_dir_).pathname_.
                    _M_dataplus._M_p);
      if (iVar1 == 0) {
        execve(**child_arg,*child_arg,_environ);
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"execve(","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_58);
        local_e0 = (ulong *)*plVar3;
        puVar8 = (ulong *)(plVar3 + 2);
        if (local_e0 == puVar8) {
          local_d0 = *puVar8;
          lStack_c8 = plVar3[3];
          local_e0 = &local_d0;
        }
        else {
          local_d0 = *puVar8;
        }
        local_d8 = plVar3[1];
        *plVar3 = (long)puVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_e0);
        local_c0 = (undefined8 *)*puVar4;
        puVar6 = puVar4 + 2;
        if (local_c0 == puVar6) {
          local_b0 = *puVar6;
          uStack_a8 = puVar4[3];
          local_c0 = &local_b0;
        }
        else {
          local_b0 = *puVar6;
        }
        local_b8 = puVar4[1];
        *puVar4 = puVar6;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
        local_a0 = (long *)*puVar4;
        plVar3 = puVar4 + 2;
        if (local_a0 == plVar3) {
          local_90 = *plVar3;
          lStack_88 = puVar4[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar3;
        }
        local_98 = puVar4[1];
        *puVar4 = plVar3;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
        local_120 = (ulong *)*puVar4;
        puVar8 = puVar4 + 2;
        if (local_120 == puVar8) {
          local_110 = *puVar8;
          lStack_108 = puVar4[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *puVar8;
        }
        local_118 = puVar4[1];
        *puVar4 = puVar8;
        puVar4[1] = 0;
        *(undefined1 *)(puVar4 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar10 = 0xf;
        if (local_120 != &local_110) {
          uVar10 = local_110;
        }
        puVar8 = local_78;
        if (uVar10 < (ulong)(local_70 + local_118)) {
          uVar10 = 0xf;
          if (local_78 != local_68) {
            uVar10 = local_68[0];
          }
          if ((ulong)(local_70 + local_118) <= uVar10) {
            ppuVar11 = &local_78;
LAB_0013601a:
            plVar3 = (long *)std::__cxx11::string::replace
                                       ((ulong)ppuVar11,0,(char *)0x0,(ulong)local_120);
            goto LAB_00136023;
          }
        }
      }
      else {
        local_c0 = &local_b0;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"chdir(\"","");
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_c0);
        local_a0 = (long *)*plVar3;
        plVar5 = plVar3 + 2;
        if (local_a0 == plVar5) {
          local_90 = *plVar5;
          lStack_88 = plVar3[3];
          local_a0 = &local_90;
        }
        else {
          local_90 = *plVar5;
        }
        local_98 = plVar3[1];
        *plVar3 = (long)plVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_a0);
        local_120 = (ulong *)*plVar3;
        puVar8 = (ulong *)(plVar3 + 2);
        if (local_120 == puVar8) {
          local_110 = *puVar8;
          lStack_108 = plVar3[3];
          local_120 = &local_110;
        }
        else {
          local_110 = *puVar8;
        }
        local_118 = plVar3[1];
        *plVar3 = (long)puVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        GetLastErrnoDescription_abi_cxx11_();
        uVar10 = 0xf;
        if (local_120 != &local_110) {
          uVar10 = local_110;
        }
        puVar8 = local_e0;
        if (uVar10 < (ulong)(local_d8 + local_118)) {
          uVar10 = 0xf;
          if (local_e0 != &local_d0) {
            uVar10 = local_d0;
          }
          if ((ulong)(local_d8 + local_118) <= uVar10) {
            ppuVar11 = &local_e0;
            goto LAB_0013601a;
          }
        }
      }
      plVar3 = (long *)std::__cxx11::string::_M_append((char *)&local_120,(ulong)puVar8);
      goto LAB_00136023;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"CHECK failed: File ","");
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
  local_58 = (long *)*plVar3;
  plVar5 = plVar3 + 2;
  if (local_58 == plVar5) {
    local_48 = *plVar5;
    lStack_40 = plVar3[3];
    local_58 = &local_48;
  }
  else {
    local_48 = *plVar5;
  }
  local_50 = plVar3[1];
  *plVar3 = (long)plVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_58);
  local_e0 = (ulong *)*puVar4;
  puVar8 = puVar4 + 2;
  if (local_e0 == puVar8) {
    local_d0 = *puVar8;
    lStack_c8 = puVar4[3];
    local_e0 = &local_d0;
  }
  else {
    local_d0 = *puVar8;
  }
  local_d8 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  local_7c = 0x3c3;
  StreamableToString<int>(&local_38,&local_7c);
  uVar10 = 0xf;
  if (local_e0 != &local_d0) {
    uVar10 = local_d0;
  }
  if (uVar10 < local_38._M_string_length + local_d8) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      uVar9 = local_38.field_2._M_allocated_capacity;
    }
    if (local_38._M_string_length + local_d8 <= (ulong)uVar9) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_38,0,(char *)0x0,(ulong)local_e0);
      goto LAB_00135f02;
    }
  }
  puVar4 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_38._M_dataplus._M_p);
LAB_00135f02:
  local_c0 = (undefined8 *)*puVar4;
  puVar6 = puVar4 + 2;
  if (local_c0 == puVar6) {
    local_b0 = *puVar6;
    uStack_a8 = puVar4[3];
    local_c0 = &local_b0;
  }
  else {
    local_b0 = *puVar6;
  }
  local_b8 = puVar4[1];
  *puVar4 = puVar6;
  puVar4[1] = 0;
  *(undefined1 *)puVar6 = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_c0);
  local_a0 = (long *)*puVar4;
  plVar3 = puVar4 + 2;
  if (local_a0 == plVar3) {
    local_90 = *plVar3;
    lStack_88 = puVar4[3];
    local_a0 = &local_90;
  }
  else {
    local_90 = *plVar3;
  }
  local_98 = puVar4[1];
  *puVar4 = plVar3;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_a0);
  local_120 = (ulong *)*puVar4;
  puVar8 = puVar4 + 2;
  if (local_120 == puVar8) {
    local_110 = *puVar8;
    lStack_108 = puVar4[3];
    local_120 = &local_110;
  }
  else {
    local_110 = *puVar8;
  }
  local_118 = puVar4[1];
  *puVar4 = puVar8;
  puVar4[1] = 0;
  *(undefined1 *)(puVar4 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_120);
LAB_00136023:
  local_100._M_dataplus._M_p = (pointer)*plVar3;
  psVar7 = (size_type *)(plVar3 + 2);
  if ((size_type *)local_100._M_dataplus._M_p == psVar7) {
    local_100.field_2._M_allocated_capacity = *psVar7;
    local_100.field_2._8_8_ = plVar3[3];
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  }
  else {
    local_100.field_2._M_allocated_capacity = *psVar7;
  }
  local_100._M_string_length = plVar3[1];
  *plVar3 = (long)psVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  DeathTestAbort(&local_100);
}

Assistant:

static int ExecDeathTestChildMain(void* child_arg) {
  ExecDeathTestArgs* const args = static_cast<ExecDeathTestArgs*>(child_arg);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(args->close_fd));

  // We need to execute the test program in the same environment where
  // it was originally invoked.  Therefore we change to the original
  // working directory first.
  const char* const original_dir =
      UnitTest::GetInstance()->original_working_dir();
  // We can safely call chdir() as it's a direct system call.
  if (chdir(original_dir) != 0) {
    DeathTestAbort(std::string("chdir(\"") + original_dir + "\") failed: " +
                   GetLastErrnoDescription());
    return EXIT_FAILURE;
  }

  // We can safely call execve() as it's a direct system call.  We
  // cannot use execvp() as it's a libc function and thus potentially
  // unsafe.  Since execve() doesn't search the PATH, the user must
  // invoke the test program via a valid path that contains at least
  // one path separator.
  execve(args->argv[0], args->argv, GetEnviron());
  DeathTestAbort(std::string("execve(") + args->argv[0] + ", ...) in " +
                 original_dir + " failed: " +
                 GetLastErrnoDescription());
  return EXIT_FAILURE;
}